

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_set_enable_masked_comp(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  int *piVar3;
  av1_extracfg extra_cfg;
  av1_extracfg aStack_268;
  
  memcpy(&aStack_268,&ctx->extra_cfg,600);
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    piVar3 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    piVar3 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = piVar3 + 2;
  }
  aStack_268.enable_masked_comp = *piVar3;
  aVar2 = update_extra_cfg(ctx,&aStack_268);
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_enable_masked_comp(aom_codec_alg_priv_t *ctx,
                                                   va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  extra_cfg.enable_masked_comp = CAST(AV1E_SET_ENABLE_MASKED_COMP, args);
  return update_extra_cfg(ctx, &extra_cfg);
}